

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O0

Histogram * __thiscall Histogram::operator=(Histogram *this,Histogram *src)

{
  double dVar1;
  __int_type _Var2;
  double *in_RSI;
  Histogram *in_RDI;
  size_t i;
  memory_order __b_1;
  memory_order __b;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff90;
  HistBin *pHVar3;
  ulong local_50;
  
  in_RDI->EXP_BASE = *in_RSI;
  in_RDI->EXP_BASE_LOG = in_RSI[1];
  getTotal((Histogram *)0x23ea11);
  std::__atomic_base<unsigned_long>::operator=
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
            );
  getSum((Histogram *)0x23ea2c);
  std::__atomic_base<unsigned_long>::operator=
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
            );
  getMax((Histogram *)0x23ea47);
  std::__atomic_base<unsigned_long>::operator=
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
            );
  for (local_50 = 0; local_50 < 0x41; local_50 = local_50 + 1) {
    pHVar3 = in_RDI->bins + local_50;
    dVar1 = in_RSI[2];
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    _Var2 = *(__int_type *)((long)dVar1 + local_50 * 8);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    (pHVar3->super___atomic_base<unsigned_long>)._M_i = _Var2;
    UNLOCK();
  }
  return in_RDI;
}

Assistant:

Histogram& operator=(const Histogram& src) {
        EXP_BASE = src.EXP_BASE;
        EXP_BASE_LOG = src.EXP_BASE_LOG;
        count = src.getTotal();
        sum = src.getSum();
        max = src.getMax();
        for (size_t i=0; i<MAX_BINS; ++i) {
            bins[i].store( src.bins[i].load() );
        }
        return *this;
    }